

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_replaceRangeCString_success_indexAndRangeInBounds_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x134b96;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"xx2xx5xx",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x134bdc;
  bVar1 = AString_replaceRangeCString(&string,0,2,"01",2);
  if (bVar1 == false) {
    pcVar4 = "Assertion \'AString_replaceRangeCString(&string, 0, 2, \"01\", 2)\' failed";
    iVar2 = 0x5bc;
LAB_0013513c:
    uStack_50 = 0x135148;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar4,0,0);
  }
  uStack_50 = 0x134bf5;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5bc);
  if (string.capacity != 8) {
    local_60 = "(8)";
    pcVar5 = "(string).capacity == (8)";
    pcVar8 = "(string).capacity";
    pcVar4 = (char *)string.capacity;
LAB_00134f8f:
    iVar2 = 0x5bd;
LAB_00135243:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    local_58 = (char *)0x8;
    ppcVar6 = &local_60;
    goto LAB_0013524b;
  }
  uStack_50 = 0x134c15;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5bd);
  if (string.buffer == (char *)0x0) {
    ppcVar7 = &local_58;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (string).buffer != NULL";
    pcVar9 = "(void*) (string).buffer";
    iVar2 = 0x5bd;
    goto LAB_00135296;
  }
  uStack_50 = 0x134c32;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5bd);
  pcVar9 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar4 = "";
    pcVar9 = "(null)";
LAB_00134f23:
    local_60 = "012xx5xx";
    pcStack_70 = "(\"012xx5xx\")";
    pcVar5 = "(string).buffer == (\"012xx5xx\")";
    iVar2 = 0x5bd;
  }
  else {
    uStack_50 = 0x134c4f;
    iVar2 = strcmp("012xx5xx",string.buffer);
    if (iVar2 != 0) {
      pcVar4 = "\"";
      goto LAB_00134f23;
    }
    uStack_50 = 0x134c68;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5bd);
    if (string.size != 8) {
      local_60 = "strlen(\"012xx5xx\")";
      pcVar5 = "(string).size == strlen(\"012xx5xx\")";
      pcVar8 = "(string).size";
      pcVar4 = (char *)string.size;
      goto LAB_00134f8f;
    }
    uStack_50 = 0x134c88;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5bd);
    if (private_ACUtilsTest_AString_reallocCount != 0) {
      ppcVar7 = &local_68;
      local_60 = "(0)";
      local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
      pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
      pcVar9 = "private_ACUtilsTest_AString_reallocCount";
      iVar2 = 0x5be;
LAB_00135296:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) = test_AString_replaceRangeCString_success_zeroCount_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_50 = 0x134ca9;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5be);
    uStack_50 = 0x134cc8;
    bVar1 = AString_replaceRangeCString(&string,3,2,"34",2);
    if (bVar1 == false) {
      pcVar4 = "Assertion \'AString_replaceRangeCString(&string, 3, 2, \"34\", 2)\' failed";
      iVar2 = 0x5bf;
      goto LAB_0013513c;
    }
    uStack_50 = 0x134ce1;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5bf);
    if (string.capacity != 8) {
      local_60 = "(8)";
      pcVar5 = "(string).capacity == (8)";
      pcVar8 = "(string).capacity";
      pcVar4 = (char *)string.capacity;
LAB_001350dd:
      iVar2 = 0x5c0;
      goto LAB_00135243;
    }
    uStack_50 = 0x134d01;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5c0);
    if (string.buffer == (char *)0x0) {
      ppcVar7 = &local_58;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (string).buffer != NULL";
      pcVar9 = "(void*) (string).buffer";
      iVar2 = 0x5c0;
      goto LAB_00135296;
    }
    uStack_50 = 0x134d1e;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5c0);
    pcVar9 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar4 = "";
      pcVar9 = "(null)";
LAB_00135071:
      local_60 = "012345xx";
      pcStack_70 = "(\"012345xx\")";
      pcVar5 = "(string).buffer == (\"012345xx\")";
      iVar2 = 0x5c0;
    }
    else {
      uStack_50 = 0x134d3b;
      iVar2 = strcmp("012345xx",string.buffer);
      if (iVar2 != 0) {
        pcVar4 = "\"";
        goto LAB_00135071;
      }
      uStack_50 = 0x134d54;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5c0);
      if (string.size != 8) {
        local_60 = "strlen(\"012345xx\")";
        pcVar5 = "(string).size == strlen(\"012345xx\")";
        pcVar8 = "(string).size";
        pcVar4 = (char *)string.size;
        goto LAB_001350dd;
      }
      uStack_50 = 0x134d74;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5c0);
      if (private_ACUtilsTest_AString_reallocCount != 0) {
        ppcVar7 = &local_68;
        local_60 = "(0)";
        local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
        pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
        pcVar9 = "private_ACUtilsTest_AString_reallocCount";
        iVar2 = 0x5c1;
        goto LAB_00135296;
      }
      uStack_50 = 0x134d95;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5c1);
      uStack_50 = 0x134db4;
      bVar1 = AString_replaceRangeCString(&string,6,2,"67",2);
      if (bVar1 == false) {
        pcVar4 = "Assertion \'AString_replaceRangeCString(&string, 6, 2, \"67\", 2)\' failed";
        iVar2 = 0x5c2;
        goto LAB_0013513c;
      }
      uStack_50 = 0x134dcd;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5c2);
      if (string.capacity != 8) {
        local_60 = "(8)";
        pcVar5 = "(string).capacity == (8)";
        pcVar8 = "(string).capacity";
        pcVar4 = (char *)string.capacity;
LAB_0013523e:
        iVar2 = 0x5c3;
        goto LAB_00135243;
      }
      uStack_50 = 0x134ded;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5c3);
      if (string.buffer == (char *)0x0) {
        ppcVar7 = &local_58;
        pcVar5 = "Assertion \'_ck_x != NULL\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %#x";
        pcVar8 = "(void*) (string).buffer != NULL";
        pcVar9 = "(void*) (string).buffer";
        iVar2 = 0x5c3;
        goto LAB_00135296;
      }
      uStack_50 = 0x134e0a;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5c3);
      pcVar9 = string.buffer;
      if (string.buffer == (char *)0x0) {
        pcVar9 = "(null)";
        pcVar4 = "";
      }
      else {
        uStack_50 = 0x134e27;
        iVar2 = strcmp("01234567",string.buffer);
        if (iVar2 == 0) {
          uStack_50 = 0x134e40;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5c3);
          if (string.size == 8) {
            uStack_50 = 0x134e60;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x5c3);
            if (private_ACUtilsTest_AString_reallocCount == 0) {
              uStack_50 = 0x134e81;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x5c4);
              uStack_50 = 0x134e8a;
              (*string.deallocator)(string.buffer);
              return;
            }
            ppcVar7 = &local_68;
            local_60 = "(0)";
            local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
            pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar9 = "private_ACUtilsTest_AString_reallocCount";
            iVar2 = 0x5c4;
            goto LAB_00135296;
          }
          local_60 = "strlen(\"01234567\")";
          pcVar5 = "(string).size == strlen(\"01234567\")";
          pcVar8 = "(string).size";
          pcVar4 = (char *)string.size;
          goto LAB_0013523e;
        }
        pcVar4 = "\"";
      }
      local_60 = "01234567";
      pcStack_70 = "(\"01234567\")";
      pcVar5 = "(string).buffer == (\"01234567\")";
      iVar2 = 0x5c3;
    }
  }
  pcVar8 = "(string).buffer";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_68 = "\"";
  ppcVar6 = &pcStack_80;
  pcStack_80 = pcVar9;
  pcStack_78 = pcVar4;
LAB_0013524b:
  uStack_50 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x135252;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar5,pcVar8);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}